

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::addProperty
          (ast *this,Scope *scope,string_view name,VariableLifetime lifetime,
          StructBuilder *structBuilder)

{
  ClassPropertySymbol *member;
  undefined4 in_register_00000084;
  Visibility local_28;
  VariableLifetime local_24;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = (char *)name._M_len;
  local_24 = (VariableLifetime)name._M_str;
  local_28 = Public;
  local_20._M_len = (size_t)scope;
  member = BumpAllocator::
           emplace<slang::ast::ClassPropertySymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation_const&,slang::ast::VariableLifetime&,slang::ast::Visibility>
                     (*(BumpAllocator **)this,&local_20,
                      (SourceLocation *)&SourceLocation::NoLocation,&local_24,&local_28);
  (member->super_VariableSymbol).super_ValueSymbol.declaredType.type =
       *(Type **)(CONCAT44(in_register_00000084,lifetime) + 8);
  Scope::insertMember((Scope *)this,(Symbol *)member,*(Symbol **)(this + 0x20),false,true);
  return;
}

Assistant:

static void addProperty(Scope& scope, std::string_view name, VariableLifetime lifetime,
                        const StructBuilder& structBuilder) {
    auto& comp = scope.getCompilation();
    auto& prop = *comp.emplace<ClassPropertySymbol>(name, SourceLocation::NoLocation, lifetime,
                                                    Visibility::Public);
    prop.setType(structBuilder.type);
    scope.addMember(prop);
}